

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

TValue * ffi_clib_index(lua_State *L)

{
  ulong uVar1;
  int tt;
  TValue *pTVar2;
  int narg;
  ulong uVar3;
  
  pTVar2 = L->base;
  if (((pTVar2 < L->top) && ((pTVar2->field_4).it >> 0xf == 0x1fff3)) &&
     (uVar3 = (ulong)pTVar2->field_4 & 0x7fffffffffff, *(char *)(uVar3 + 10) == '\x02')) {
    if ((pTVar2 + 1 < L->top) &&
       (uVar1 = pTVar2[1].u64, (uVar1 & 0xffff800000000000) == 0xfffd800000000000)) {
      pTVar2 = lj_clib_index(L,(CLibrary *)(uVar3 + 0x30),(GCstr *)(uVar1 & 0x7fffffffffff));
      return pTVar2;
    }
    narg = 2;
    tt = 4;
  }
  else {
    narg = 1;
    tt = 7;
  }
  lj_err_argt(L,narg,tt);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}